

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

DynamicRectMatrix<double> __thiscall
OpenMD::Polynomial<double>::CreateCompanion(Polynomial<double> *this)

{
  uint nrow;
  ulong uVar1;
  ulong uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  Polynomial<double> *in_RSI;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  DynamicRectMatrix<double> DVar8;
  
  nrow = degree(in_RSI);
  DynamicRectMatrix<double>::DynamicRectMatrix((DynamicRectMatrix<double> *)this,nrow,nrow);
  dVar6 = getCoefficient(in_RSI,nrow);
  uVar5 = 0;
  uVar1 = 0;
  if (0 < (int)nrow) {
    uVar1 = (ulong)nrow;
  }
  uVar3 = extraout_RDX;
  do {
    if (uVar5 == uVar1) {
      DVar8.nrow_ = (int)uVar3;
      DVar8.ncol_ = (int)((ulong)uVar3 >> 0x20);
      DVar8.data_ = (double **)this;
      return DVar8;
    }
    for (uVar4 = 0; nrow != uVar4; uVar4 = uVar4 + 1) {
      dVar7 = 1.0;
      uVar2 = uVar4;
      if (uVar5 - 1 == uVar4) {
LAB_00227235:
        *(double *)(*(long *)(*(long *)&(this->polyPairMap_)._M_t._M_impl + uVar5 * 8) + uVar2 * 8)
             = dVar7;
      }
      else if (nrow - 1 == uVar4) {
        dVar7 = getCoefficient(in_RSI,(ExponentType)uVar5);
        dVar7 = -dVar7 / dVar6;
        uVar2 = (ulong)(nrow - 1);
        uVar3 = extraout_RDX_00;
        goto LAB_00227235;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

DynamicRectMatrix<Real> CreateCompanion() {
      int rank = degree();
      DynamicRectMatrix<Real> mat(rank, rank);
      Real majorCoeff = getCoefficient(rank);
      for (int i = 0; i < rank; ++i) {
        for (int j = 0; j < rank; ++j) {
          if (i - j == 1) {
            mat(i, j) = 1;
          } else if (j == rank - 1) {
            mat(i, j) = -1 * getCoefficient(i) / majorCoeff;
          }
        }
      }
      return mat;
    }